

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeI31Get(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Expression *i31_00;
  I31Get *pIVar2;
  bool local_39;
  HeapType local_30;
  Expression *local_28;
  Expression *i31;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  i31._4_4_ = 2;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&i31 + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1431,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
  }
  bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
  local_39 = false;
  if (bVar1) {
    local_39 = FeatureSet::hasGC(&this->wasm->features);
  }
  if (local_39 != false) {
    HeapType::HeapType(&local_30,i31);
    i31_00 = makeTrappingRefUse(this,local_30);
    local_28 = i31_00;
    bVar1 = oneIn(this,2);
    pIVar2 = Builder::makeI31Get(&this->builder,i31_00,bVar1);
    return (Expression *)pIVar2;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1432,"Expression *wasm::TranslateToFuzzReader::makeI31Get(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeI31Get(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* i31 = makeTrappingRefUse(HeapType::i31);
  return builder.makeI31Get(i31, bool(oneIn(2)));
}